

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O1

int divideby(int M,int d)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)M;
  while ((int)uVar1 % d == 0) {
    uVar1 = (long)M / (long)d;
    M = (int)uVar1;
  }
  return (int)(M == 1);
}

Assistant:

int divideby(int M,int d) {
	while (M%d == 0) {
		M = M/d;
	}
	if (M == 1) {
		return 1;
	}
	 return 0;
}